

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrCore.cpp
# Opt level: O0

void __thiscall amrex::AmrCore::regrid(AmrCore *this,int lbase,Real time,bool param_4)

{
  long lVar1;
  BoxArray *pBVar2;
  byte in_DL;
  int in_ESI;
  long *in_RDI;
  undefined8 in_XMM0_Qa;
  int lev_1;
  uint old_num_setdm_1;
  DistributionMapping new_dmap;
  uint old_num_setdm;
  DistributionMapping level_dmap;
  BoxArray level_grids;
  bool ba_changed;
  int lev;
  bool coarse_ba_changed;
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> new_grids;
  int new_finest;
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *in_stack_00000850;
  int *in_stack_00000858;
  Real in_stack_00000860;
  int in_stack_0000086c;
  AmrMesh *in_stack_00000870;
  BoxArray *in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffec4;
  undefined8 in_stack_fffffffffffffec8;
  AmrMesh *in_stack_fffffffffffffed0;
  BoxArray *in_stack_fffffffffffffed8;
  BoxArray *in_stack_fffffffffffffee0;
  int local_100;
  undefined1 local_f8 [20];
  int local_e4;
  int in_stack_ffffffffffffff2c;
  AmrMesh *in_stack_ffffffffffffff30;
  BoxArray local_c0;
  byte local_55;
  int local_54;
  byte local_4d;
  int local_20;
  byte local_19;
  undefined8 local_18;
  int local_c;
  
  local_19 = in_DL & 1;
  if (in_ESI < *(int *)((long)in_RDI + 0xc)) {
    local_18 = in_XMM0_Qa;
    local_c = in_ESI;
    std::allocator<amrex::BoxArray>::allocator((allocator<amrex::BoxArray> *)0x18ddc1f);
    Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::vector
              ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
               CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
               (size_type)in_stack_fffffffffffffeb8,(allocator_type *)0x18ddc36);
    std::allocator<amrex::BoxArray>::~allocator((allocator<amrex::BoxArray> *)0x18ddc45);
    AmrMesh::MakeNewGrids
              (in_stack_00000870,in_stack_0000086c,in_stack_00000860,in_stack_00000858,
               in_stack_00000850);
    local_4d = 0;
    while (local_54 = local_c + 1, local_100 = local_20, local_54 <= local_20) {
      if (*(int *)((long)in_RDI + 0x94) < local_54) {
        in_stack_fffffffffffffed0 =
             (AmrMesh *)
             Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
                       ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                        CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                        (size_type)in_stack_fffffffffffffeb8);
        ParallelDescriptor::NProcs();
        DistributionMapping::DistributionMapping
                  ((DistributionMapping *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                   (int)((ulong)in_stack_fffffffffffffed0 >> 0x20));
        lVar1 = in_RDI[0x1c];
        in_stack_fffffffffffffec4 = local_54;
        in_stack_fffffffffffffec8 = local_18;
        pBVar2 = Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
                           ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                            CONCAT44(local_54,in_stack_fffffffffffffec0),
                            (size_type)in_stack_fffffffffffffeb8);
        (**(code **)(*in_RDI + 0x40))
                  (in_stack_fffffffffffffec8,in_RDI,in_stack_fffffffffffffec4,pBVar2,local_f8);
        in_stack_fffffffffffffec0 = local_54;
        Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
                  ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                   CONCAT44(in_stack_fffffffffffffec4,local_54),(size_type)in_stack_fffffffffffffeb8
                  );
        AmrMesh::SetBoxArray
                  (in_stack_fffffffffffffed0,(int)((ulong)in_stack_fffffffffffffec8 >> 0x20),
                   (BoxArray *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
        if ((int)lVar1 == (int)in_RDI[0x1c]) {
          AmrMesh::SetDistributionMap
                    (in_stack_fffffffffffffed0,(int)((ulong)in_stack_fffffffffffffec8 >> 0x20),
                     (DistributionMapping *)
                     CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
        }
        DistributionMapping::~DistributionMapping((DistributionMapping *)0x18ddff9);
        local_c = local_54;
      }
      else {
        in_stack_fffffffffffffee0 =
             Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
                       ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                        CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                        (size_type)in_stack_fffffffffffffeb8);
        Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
                  ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                   CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                   (size_type)in_stack_fffffffffffffeb8);
        local_55 = BoxArray::operator!=
                             ((BoxArray *)
                              CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                              in_stack_fffffffffffffeb8);
        if (((bool)local_55) || ((local_4d & 1) != 0)) {
          Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
                    ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                     CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                     (size_type)in_stack_fffffffffffffeb8);
          BoxArray::BoxArray((BoxArray *)
                             CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                             in_stack_fffffffffffffeb8);
          Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::
          operator[]((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                      *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                     (size_type)in_stack_fffffffffffffeb8);
          DistributionMapping::DistributionMapping
                    ((DistributionMapping *)
                     CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                     (DistributionMapping *)in_stack_fffffffffffffeb8);
          if ((local_55 & 1) != 0) {
            Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
                      ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                       CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                       (size_type)in_stack_fffffffffffffeb8);
            in_stack_fffffffffffffed8 = &local_c0;
            BoxArray::operator=((BoxArray *)
                                CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                                in_stack_fffffffffffffeb8);
            ParallelDescriptor::NProcs();
            DistributionMapping::DistributionMapping
                      ((DistributionMapping *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                       (int)((ulong)in_stack_fffffffffffffed0 >> 0x20));
            DistributionMapping::operator=
                      ((DistributionMapping *)
                       CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                       (DistributionMapping *)in_stack_fffffffffffffeb8);
            DistributionMapping::~DistributionMapping((DistributionMapping *)0x18dddd1);
          }
          local_e4 = (int)in_RDI[0x1c];
          (**(code **)(*in_RDI + 0x48))(local_18,in_RDI,local_54,&local_c0,&stack0xffffffffffffff30)
          ;
          AmrMesh::SetBoxArray
                    (in_stack_fffffffffffffed0,(int)((ulong)in_stack_fffffffffffffec8 >> 0x20),
                     (BoxArray *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
          if (local_e4 == (int)in_RDI[0x1c]) {
            AmrMesh::SetDistributionMap
                      (in_stack_fffffffffffffed0,(int)((ulong)in_stack_fffffffffffffec8 >> 0x20),
                       (DistributionMapping *)
                       CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
          }
          DistributionMapping::~DistributionMapping((DistributionMapping *)0x18ddec3);
          BoxArray::~BoxArray((BoxArray *)
                              CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
        }
        local_4d = local_55 & 1;
        local_c = local_54;
      }
    }
    while (local_100 = local_100 + 1, local_100 <= *(int *)((long)in_RDI + 0x94)) {
      (**(code **)(*in_RDI + 0x50))(in_RDI,local_100);
      AmrMesh::ClearBoxArray(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
      AmrMesh::ClearDistributionMap
                (in_stack_fffffffffffffed0,(int)((ulong)in_stack_fffffffffffffec8 >> 0x20));
    }
    *(int *)((long)in_RDI + 0x94) = local_20;
    Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::~Vector
              ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)0x18de08c);
  }
  return;
}

Assistant:

void
AmrCore::regrid (int lbase, Real time, bool)
{
    if (lbase >= max_level) return;

    int new_finest;
    Vector<BoxArray> new_grids(finest_level+2);
    MakeNewGrids(lbase, time, new_finest, new_grids);

    BL_ASSERT(new_finest <= finest_level+1);

    bool coarse_ba_changed = false;
    for (int lev = lbase+1; lev <= new_finest; ++lev)
    {
        if (lev <= finest_level) // an old level
        {
            bool ba_changed = (new_grids[lev] != grids[lev]);
            if (ba_changed || coarse_ba_changed) {
                BoxArray level_grids = grids[lev];
                DistributionMapping level_dmap = dmap[lev];
                if (ba_changed) {
                    level_grids = new_grids[lev];
                    level_dmap = DistributionMapping(level_grids);
                }
                const auto old_num_setdm = num_setdm;
                RemakeLevel(lev, time, level_grids, level_dmap);
                SetBoxArray(lev, level_grids);
                if (old_num_setdm == num_setdm) {
                    SetDistributionMap(lev, level_dmap);
                }
            }
            coarse_ba_changed = ba_changed;;
        }
        else  // a new level
        {
            DistributionMapping new_dmap(new_grids[lev]);
            const auto old_num_setdm = num_setdm;
            MakeNewLevelFromCoarse(lev, time, new_grids[lev], new_dmap);
            SetBoxArray(lev, new_grids[lev]);
            if (old_num_setdm == num_setdm) {
                SetDistributionMap(lev, new_dmap);
            }
        }
    }

    for (int lev = new_finest+1; lev <= finest_level; ++lev) {
        ClearLevel(lev);
        ClearBoxArray(lev);
        ClearDistributionMap(lev);
    }

    finest_level = new_finest;
}